

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharedRenderingPerfTests.cpp
# Opt level: O3

void deqp::egl::anon_unknown_0::anon_unknown_5::createIndexData
               (vector<unsigned_short,_std::allocator<unsigned_short>_> *data,TestConfig *config)

{
  unsigned_short *puVar1;
  unsigned_short *__args;
  iterator iVar2;
  uint uVar3;
  unsigned_short local_3c [6];
  
  if (0 < config->triangleCount) {
    uVar3 = 0;
    do {
      if ((uVar3 & 1) == 0) {
        local_3c[5] = 0;
        iVar2._M_current =
             (data->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        puVar1 = (data->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl
                 .super__Vector_impl_data._M_end_of_storage;
        if (iVar2._M_current == puVar1) {
          std::vector<unsigned_short,_std::allocator<unsigned_short>_>::
          _M_realloc_insert<unsigned_short>(data,iVar2,local_3c + 5);
          iVar2._M_current =
               (data->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          puVar1 = (data->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>).
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
        }
        else {
          *iVar2._M_current = 0;
          iVar2._M_current = iVar2._M_current + 1;
          (data->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
          super__Vector_impl_data._M_finish = iVar2._M_current;
        }
        local_3c[4] = 1;
        if (iVar2._M_current == puVar1) {
          std::vector<unsigned_short,_std::allocator<unsigned_short>_>::
          _M_realloc_insert<unsigned_short>(data,iVar2,local_3c + 4);
          iVar2._M_current =
               (data->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          puVar1 = (data->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>).
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
        }
        else {
          *iVar2._M_current = 1;
          iVar2._M_current = iVar2._M_current + 1;
          (data->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
          super__Vector_impl_data._M_finish = iVar2._M_current;
        }
        local_3c[3] = 2;
        if (iVar2._M_current == puVar1) {
          __args = local_3c + 3;
          goto LAB_001f9cae;
        }
        *iVar2._M_current = 2;
LAB_001f9c94:
        (data->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
        super__Vector_impl_data._M_finish = iVar2._M_current + 1;
      }
      else {
        local_3c[2] = 2;
        iVar2._M_current =
             (data->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        puVar1 = (data->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl
                 .super__Vector_impl_data._M_end_of_storage;
        if (iVar2._M_current == puVar1) {
          std::vector<unsigned_short,_std::allocator<unsigned_short>_>::
          _M_realloc_insert<unsigned_short>(data,iVar2,local_3c + 2);
          iVar2._M_current =
               (data->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          puVar1 = (data->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>).
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
        }
        else {
          *iVar2._M_current = 2;
          iVar2._M_current = iVar2._M_current + 1;
          (data->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
          super__Vector_impl_data._M_finish = iVar2._M_current;
        }
        local_3c[1] = 3;
        if (iVar2._M_current == puVar1) {
          std::vector<unsigned_short,_std::allocator<unsigned_short>_>::
          _M_realloc_insert<unsigned_short>(data,iVar2,local_3c + 1);
          iVar2._M_current =
               (data->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          puVar1 = (data->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>).
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
        }
        else {
          *iVar2._M_current = 3;
          iVar2._M_current = iVar2._M_current + 1;
          (data->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
          super__Vector_impl_data._M_finish = iVar2._M_current;
        }
        local_3c[0] = 0;
        __args = local_3c;
        if (iVar2._M_current != puVar1) {
          *iVar2._M_current = 0;
          goto LAB_001f9c94;
        }
LAB_001f9cae:
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::
        _M_realloc_insert<unsigned_short>(data,iVar2,__args);
      }
      uVar3 = uVar3 + 1;
    } while ((int)uVar3 < config->triangleCount);
  }
  return;
}

Assistant:

void createIndexData (vector<deUint16>& data, const TestConfig& config)
{
	for (int triangleNdx = 0; triangleNdx < config.triangleCount; triangleNdx++)
	{
		if ((triangleNdx % 2) == 0)
		{
			data.push_back(0);
			data.push_back(1);
			data.push_back(2);
		}
		else
		{
			data.push_back(2);
			data.push_back(3);
			data.push_back(0);
		}
	}
}